

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailcallFieldParseFunctions
          (ParseFunctionGenerator *this,Formatter *format)

{
  bool bVar1;
  LogMessage *other;
  anon_struct_16_2_3fed9ca0 *layout_1;
  anon_struct_16_2_3fed9ca0 *__end3_1;
  anon_struct_16_2_3fed9ca0 *__begin3_1;
  anon_struct_16_2_3fed9ca0 (*__range3_1) [2];
  anon_struct_16_2_3fed9ca0 *layout;
  anon_struct_16_2_3fed9ca0 *__end3;
  anon_struct_16_2_3fed9ca0 *__begin3;
  anon_struct_16_2_3fed9ca0 (*__range3) [2];
  anon_struct_16_2_3fed9ca0 kTagLayouts [2];
  LogMessage local_50;
  Formatter *local_18;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  local_18 = format;
  format_local = (Formatter *)this;
  bVar1 = should_generate_tctable(this);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x196);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&kTagLayouts[1].size + 3),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  __range3 = (anon_struct_16_2_3fed9ca0 (*) [2])anon_var_dwarf_22dff4;
  kTagLayouts[0].type = (char *)0x1;
  kTagLayouts[0]._8_8_ = (long)" too big for uint16_t" + 0xd;
  kTagLayouts[1].type = (char *)0x2;
  for (__end3 = (anon_struct_16_2_3fed9ca0 *)&__range3;
      __end3 != (anon_struct_16_2_3fed9ca0 *)&kTagLayouts[1].size; __end3 = __end3 + 1) {
    Formatter::operator()
              (local_18,
               "#if PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\nconst char* $classname$::Tct_ParseS$1$(PROTOBUF_TC_PARAM_DECL) {\n  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0))\n    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);\n  ptr += $1$;\n  hasbits |= (uint64_t{1} << data.hasbit_idx());\n  ::$proto_ns$::internal::TcParser::SyncHasbits(msg, hasbits, table);\n  auto& field = ::$proto_ns$::internal::TcParser::RefAt<$classtype$*>(msg, data.offset());\n  if (field == nullptr)\n    field = CreateMaybeMessage<$classtype$>(ctx->data().arena);\n  return ctx->ParseMessage(field, ptr);\n}\n#endif  // PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\n"
               ,&__end3->size,&__end3->type);
  }
  for (__end3_1 = (anon_struct_16_2_3fed9ca0 *)&__range3;
      __end3_1 != (anon_struct_16_2_3fed9ca0 *)&kTagLayouts[1].size; __end3_1 = __end3_1 + 1) {
    Formatter::operator()
              (local_18,
               "#if PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\nconst char* $classname$::Tct_ParseR$1$(PROTOBUF_TC_PARAM_DECL) {\n  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0)) {\n    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);\n  }\n  ptr += $1$;\n  auto& field = ::$proto_ns$::internal::TcParser::RefAt<::$proto_ns$::RepeatedPtrField<$classname$>>(msg, data.offset());\n  ::$proto_ns$::internal::TcParser::SyncHasbits(msg, hasbits, table);\n  ptr = ctx->ParseMessage(field.Add(), ptr);\n  return ptr;\n}\n#endif  // PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\n"
               ,&__end3_1->size,&__end3_1->type);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailcallFieldParseFunctions(
    Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  // There are four cases where a tailcall target are needed for messages:
  //   {singular, repeated} x {1, 2}-byte tag
  struct {
    const char* type;
    int size;
  } const kTagLayouts[] = {
      {"uint8_t", 1},
      {"uint16_t", 2},
  };
  // Singular:
  for (const auto& layout : kTagLayouts) {
    // Guard macros are defined in port_def.inc.
    format(
        "#if PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\n"
        "const char* $classname$::Tct_ParseS$1$(PROTOBUF_TC_PARAM_DECL) {\n"
        "  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0))\n"
        "    PROTOBUF_MUSTTAIL "
        "return table->fallback(PROTOBUF_TC_PARAM_PASS);\n"
        "  ptr += $1$;\n"
        "  hasbits |= (uint64_t{1} << data.hasbit_idx());\n"
        "  ::$proto_ns$::internal::TcParser::SyncHasbits"
        "(msg, hasbits, table);\n"
        "  auto& field = ::$proto_ns$::internal::TcParser::"
        "RefAt<$classtype$*>(msg, data.offset());\n"
        "  if (field == nullptr)\n"
        "    field = CreateMaybeMessage<$classtype$>(ctx->data().arena);\n"
        "  return ctx->ParseMessage(field, ptr);\n"
        "}\n"
        "#endif  // PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\n",
        layout.size, layout.type);
  }
  // Repeated:
  for (const auto& layout : kTagLayouts) {
    // Guard macros are defined in port_def.inc.
    format(
        "#if PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\n"
        "const char* $classname$::Tct_ParseR$1$(PROTOBUF_TC_PARAM_DECL) {\n"
        "  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0)) {\n"
        "    PROTOBUF_MUSTTAIL "
        "return table->fallback(PROTOBUF_TC_PARAM_PASS);\n"
        "  }\n"
        "  ptr += $1$;\n"
        "  auto& field = ::$proto_ns$::internal::TcParser::RefAt<"
        "::$proto_ns$::RepeatedPtrField<$classname$>>(msg, data.offset());\n"
        "  ::$proto_ns$::internal::TcParser::SyncHasbits"
        "(msg, hasbits, table);\n"
        "  ptr = ctx->ParseMessage(field.Add(), ptr);\n"
        "  return ptr;\n"
        "}\n"
        "#endif  // PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\n",
        layout.size, layout.type);
  }
}